

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcRewrite.c
# Opt level: O0

int Abc_NtkRewrite(Abc_Ntk_t *pNtk,int fUpdateLevel,int fUseZeros,int fVerbose,int fVeryVerbose,
                  int fPlaceEnable)

{
  int iVar1;
  int iVar2;
  int iVar3;
  abctime aVar4;
  Rwr_Man_t *p;
  abctime aVar5;
  Cut_Man_t *pManCut_00;
  abctime aVar6;
  ProgressBar *p_00;
  Abc_Obj_t *pObj;
  Dec_Graph_t *pGraph_00;
  abctime clkStart;
  abctime clk;
  int fCompl;
  int nGain;
  int nNodes;
  int i;
  Dec_Graph_t *pGraph;
  Abc_Obj_t *pNode;
  Rwr_Man_t *pManRwr;
  Cut_Man_t *pManCut;
  ProgressBar *pProgress;
  int fPlaceEnable_local;
  int fVeryVerbose_local;
  int fVerbose_local;
  int fUseZeros_local;
  int fUpdateLevel_local;
  Abc_Ntk_t *pNtk_local;
  
  aVar4 = Abc_Clock();
  iVar1 = Abc_NtkIsStrash(pNtk);
  if (iVar1 == 0) {
    __assert_fail("Abc_NtkIsStrash(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcRewrite.c"
                  ,0x49,"int Abc_NtkRewrite(Abc_Ntk_t *, int, int, int, int, int)");
  }
  Abc_AigCleanup((Abc_Aig_t *)pNtk->pManFunc);
  p = Rwr_ManStart(0);
  if (p == (Rwr_Man_t *)0x0) {
    pNtk_local._4_4_ = 0;
  }
  else {
    if (fUpdateLevel != 0) {
      Abc_NtkStartReverseLevels(pNtk,0);
    }
    aVar5 = Abc_Clock();
    pManCut_00 = Abc_NtkStartCutManForRewrite(pNtk);
    aVar6 = Abc_Clock();
    Rwr_ManAddTimeCuts(p,aVar6 - aVar5);
    pNtk->pManCut = pManCut_00;
    if (fVeryVerbose != 0) {
      Rwr_ScoresClean(p);
    }
    iVar1 = Abc_NtkNodeNum(pNtk);
    p->nNodesBeg = iVar1;
    iVar1 = Abc_NtkObjNumMax(pNtk);
    p_00 = Extra_ProgressBarStart(_stdout,iVar1);
    for (nGain = 0; iVar2 = Vec_PtrSize(pNtk->vObjs), nGain < iVar2; nGain = nGain + 1) {
      pObj = Abc_NtkObj(pNtk,nGain);
      if ((pObj != (Abc_Obj_t *)0x0) && (iVar2 = Abc_ObjIsNode(pObj), iVar2 != 0)) {
        Extra_ProgressBarUpdate(p_00,nGain,(char *)0x0);
        if (iVar1 <= nGain) break;
        iVar2 = Abc_NodeIsPersistant(pObj);
        if (((iVar2 == 0) && (iVar2 = Abc_ObjFanoutNum(pObj), iVar2 < 0x3e9)) &&
           ((iVar2 = Rwr_NodeRewrite(p,pManCut_00,pObj,fUpdateLevel,fUseZeros,fPlaceEnable),
            0 < iVar2 || ((iVar2 == 0 && (fUseZeros != 0)))))) {
          pGraph_00 = (Dec_Graph_t *)Rwr_ManReadDecs(p);
          iVar3 = Rwr_ManReadCompl(p);
          if (fPlaceEnable != 0) {
            Abc_AigUpdateReset((Abc_Aig_t *)pNtk->pManFunc);
          }
          if (iVar3 != 0) {
            Dec_GraphComplement(pGraph_00);
          }
          aVar5 = Abc_Clock();
          Dec_GraphUpdateNetwork(pObj,pGraph_00,fUpdateLevel,iVar2);
          aVar6 = Abc_Clock();
          Rwr_ManAddTimeUpdate(p,aVar6 - aVar5);
          if (iVar3 != 0) {
            Dec_GraphComplement(pGraph_00);
          }
        }
      }
    }
    Extra_ProgressBarStop(p_00);
    aVar5 = Abc_Clock();
    Rwr_ManAddTimeTotal(p,aVar5 - aVar4);
    iVar1 = Abc_NtkNodeNum(pNtk);
    p->nNodesEnd = iVar1;
    if (fVerbose != 0) {
      Rwr_ManPrintStats(p);
    }
    if (fVeryVerbose != 0) {
      Rwr_ScoresReport(p);
    }
    Rwr_ManStop(p);
    Cut_ManStop(pManCut_00);
    pNtk->pManCut = (void *)0x0;
    Abc_NtkReassignIds(pNtk);
    if (fUpdateLevel == 0) {
      Abc_NtkLevel(pNtk);
    }
    else {
      Abc_NtkStopReverseLevels(pNtk);
    }
    iVar1 = Abc_NtkCheck(pNtk);
    if (iVar1 == 0) {
      printf("Abc_NtkRewrite: The network check has failed.\n");
      pNtk_local._4_4_ = 0;
    }
    else {
      pNtk_local._4_4_ = 1;
    }
  }
  return pNtk_local._4_4_;
}

Assistant:

int Abc_NtkRewrite( Abc_Ntk_t * pNtk, int fUpdateLevel, int fUseZeros, int fVerbose, int fVeryVerbose, int fPlaceEnable )
{
    extern void           Dec_GraphUpdateNetwork( Abc_Obj_t * pRoot, Dec_Graph_t * pGraph, int fUpdateLevel, int nGain );
    ProgressBar * pProgress;
    Cut_Man_t * pManCut;
    Rwr_Man_t * pManRwr;
    Abc_Obj_t * pNode;
//    Vec_Ptr_t * vAddedCells = NULL, * vUpdatedNets = NULL;
    Dec_Graph_t * pGraph;
    int i, nNodes, nGain, fCompl;
    abctime clk, clkStart = Abc_Clock();

    assert( Abc_NtkIsStrash(pNtk) );
    // cleanup the AIG
    Abc_AigCleanup((Abc_Aig_t *)pNtk->pManFunc);
/*
    {
        Vec_Vec_t * vParts;
        vParts = Abc_NtkPartitionSmart( pNtk, 50, 1 );
        Vec_VecFree( vParts );
    }
*/

    // start placement package
//    if ( fPlaceEnable )
//    {
//        Abc_PlaceBegin( pNtk );
//        vAddedCells = Abc_AigUpdateStart( pNtk->pManFunc, &vUpdatedNets );
//    }

    // start the rewriting manager
    pManRwr = Rwr_ManStart( 0 );
    if ( pManRwr == NULL )
        return 0;
    // compute the reverse levels if level update is requested
    if ( fUpdateLevel )
        Abc_NtkStartReverseLevels( pNtk, 0 );
    // start the cut manager
clk = Abc_Clock();
    pManCut = Abc_NtkStartCutManForRewrite( pNtk );
Rwr_ManAddTimeCuts( pManRwr, Abc_Clock() - clk );
    pNtk->pManCut = pManCut;

    if ( fVeryVerbose )
        Rwr_ScoresClean( pManRwr );

    // resynthesize each node once
    pManRwr->nNodesBeg = Abc_NtkNodeNum(pNtk);
    nNodes = Abc_NtkObjNumMax(pNtk);
    pProgress = Extra_ProgressBarStart( stdout, nNodes );
    Abc_NtkForEachNode( pNtk, pNode, i )
    {
        Extra_ProgressBarUpdate( pProgress, i, NULL );
        // stop if all nodes have been tried once
        if ( i >= nNodes )
            break;
        // skip persistant nodes
        if ( Abc_NodeIsPersistant(pNode) )
            continue;
        // skip the nodes with many fanouts
        if ( Abc_ObjFanoutNum(pNode) > 1000 )
            continue;

        // for each cut, try to resynthesize it
        nGain = Rwr_NodeRewrite( pManRwr, pManCut, pNode, fUpdateLevel, fUseZeros, fPlaceEnable );
        if ( !(nGain > 0 || (nGain == 0 && fUseZeros)) )
            continue;
        // if we end up here, a rewriting step is accepted

        // get hold of the new subgraph to be added to the AIG
        pGraph = (Dec_Graph_t *)Rwr_ManReadDecs(pManRwr);
        fCompl = Rwr_ManReadCompl(pManRwr);

        // reset the array of the changed nodes
        if ( fPlaceEnable )
            Abc_AigUpdateReset( (Abc_Aig_t *)pNtk->pManFunc );

        // complement the FF if needed
        if ( fCompl ) Dec_GraphComplement( pGraph );
clk = Abc_Clock();
        Dec_GraphUpdateNetwork( pNode, pGraph, fUpdateLevel, nGain );
Rwr_ManAddTimeUpdate( pManRwr, Abc_Clock() - clk );
        if ( fCompl ) Dec_GraphComplement( pGraph );

        // use the array of changed nodes to update placement
//        if ( fPlaceEnable )
//            Abc_PlaceUpdate( vAddedCells, vUpdatedNets );
    }
    Extra_ProgressBarStop( pProgress );
Rwr_ManAddTimeTotal( pManRwr, Abc_Clock() - clkStart );
    // print stats
    pManRwr->nNodesEnd = Abc_NtkNodeNum(pNtk);
    if ( fVerbose )
        Rwr_ManPrintStats( pManRwr );
//        Rwr_ManPrintStatsFile( pManRwr );
    if ( fVeryVerbose )
        Rwr_ScoresReport( pManRwr );
    // delete the managers
    Rwr_ManStop( pManRwr );
    Cut_ManStop( pManCut );
    pNtk->pManCut = NULL;

    // start placement package
//    if ( fPlaceEnable )
//    {
//        Abc_PlaceEnd( pNtk );
//        Abc_AigUpdateStop( pNtk->pManFunc );
//    }

    // put the nodes into the DFS order and reassign their IDs
    {
//        abctime clk = Abc_Clock();
    Abc_NtkReassignIds( pNtk );
//        ABC_PRT( "time", Abc_Clock() - clk );
    }
//    Abc_AigCheckFaninOrder( pNtk->pManFunc );
    // fix the levels
    if ( fUpdateLevel )
        Abc_NtkStopReverseLevels( pNtk );
    else
        Abc_NtkLevel( pNtk );
    // check
    if ( !Abc_NtkCheck( pNtk ) )
    {
        printf( "Abc_NtkRewrite: The network check has failed.\n" );
        return 0;
    }
    return 1;
}